

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool ghc::filesystem::detail::equals_simple_insensitive(char *str1,char *str2)

{
  int iVar1;
  char *str2_local;
  char *str1_local;
  
  iVar1 = strcasecmp(str1,str2);
  return iVar1 == 0;
}

Assistant:

GHC_INLINE bool equals_simple_insensitive(const char* str1, const char* str2)
{
#ifdef GHC_OS_WINDOWS
#ifdef __GNUC__
    while (::tolower((unsigned char)*str1) == ::tolower((unsigned char)*str2++)) {
        if (*str1++ == 0)
            return true;
    }
    return false;
#else
    return 0 == ::_stricmp(str1, str2);
#endif
#else
    return 0 == ::strcasecmp(str1, str2);
#endif
}